

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

int ImfHeaderFloatAttribute(ImfHeader *hdr,char *name,float *value)

{
  TypedAttribute<float> *pTVar1;
  
  pTVar1 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<float>>((Header *)hdr,name);
  *value = pTVar1->_value;
  return 1;
}

Assistant:

int
ImfHeaderFloatAttribute (const ImfHeader* hdr, const char name[], float* value)
{
    try
    {
        *value = header (hdr)
                     ->typedAttribute<
                         OPENEXR_IMF_INTERNAL_NAMESPACE::FloatAttribute> (name)
                     .value ();
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}